

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# closure.c
# Opt level: O0

void set_EFF(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_2c;
  int local_28;
  int rule;
  int i;
  int rowsize;
  Yshort *sp;
  uint *puStack_10;
  int symbol;
  uint *row;
  
  iVar1 = (nvars + 0x1f) / 0x20;
  EFF = (uint *)allocate(nvars * iVar1 * 4);
  puStack_10 = EFF;
  for (local_28 = start_symbol; local_28 < nsyms; local_28 = local_28 + 1) {
    local_2c = *derives[local_28];
    _i = derives[local_28];
    while (0 < local_2c) {
      if (start_symbol <= ritem[rrhs[local_2c]]) {
        iVar2 = ritem[rrhs[local_2c]] - start_symbol;
        iVar3 = iVar2 >> 5;
        puStack_10[iVar3] = 1 << ((byte)iVar2 & 0x1f) | puStack_10[iVar3];
      }
      local_2c = _i[1];
      _i = _i + 1;
    }
    puStack_10 = puStack_10 + iVar1;
  }
  reflexive_transitive_closure(EFF,nvars);
  return;
}

Assistant:

void set_EFF()
{
    register unsigned *row;
    register int symbol;
    register Yshort *sp;
    register int rowsize;
    register int i;
    register int rule;

    rowsize = WORDSIZE(nvars);
    EFF = NEW2(nvars * rowsize, unsigned);

    row = EFF;
    for (i = start_symbol; i < nsyms; i++)
    {
	sp = derives[i];
	for (rule = *sp; rule > 0; rule = *++sp)
	{
	    symbol = ritem[rrhs[rule]];
	    if (ISVAR(symbol))
	    {
		symbol -= start_symbol;
		SETBIT(row, symbol);
	    }
	}
	row += rowsize;
    }

    reflexive_transitive_closure(EFF, nvars);

#ifdef	DEBUG
    print_EFF();
#endif
}